

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_nodecount_levels_unmark(MDD mdd)

{
  uint8_t uVar1;
  mddnode_t n_00;
  uint64_t uVar2;
  mddnode_t n;
  MDD mdd_local;
  
  if (1 < mdd) {
    n_00 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getmark(n_00);
    if (uVar1 != '\0') {
      mddnode_setmark(n_00,'\0');
      uVar2 = mddnode_getright(n_00);
      lddmc_nodecount_levels_unmark(uVar2);
      uVar2 = mddnode_getdown(n_00);
      lddmc_nodecount_levels_unmark(uVar2);
    }
  }
  return;
}

Assistant:

static void
lddmc_nodecount_levels_unmark(MDD mdd)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) {
        mddnode_setmark(n, 0);
        lddmc_nodecount_levels_unmark(mddnode_getright(n));
        lddmc_nodecount_levels_unmark(mddnode_getdown(n));
    }
}